

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

bool __thiscall MT32Emu::Synth::playSysex(Synth *this,Bit8u *sysex,Bit32u len,Bit32u timestamp)

{
  bool bVar1;
  int iVar2;
  
  if (this->midiQueue == (MidiEventQueue *)0x0) {
    bVar1 = false;
  }
  else {
    if (this->midiDelayMode == MIDIDelayMode_DELAY_ALL) {
      if ((int)(timestamp - this->lastReceivedMIDIEventTimestamp) < 0) {
        timestamp = this->lastReceivedMIDIEventTimestamp;
      }
      timestamp = (int)(long)((double)len * 8.192) + timestamp;
      this->lastReceivedMIDIEventTimestamp = timestamp;
    }
    if (this->activated == false) {
      this->activated = true;
    }
    do {
      bVar1 = MidiEventQueue::pushSysex(this->midiQueue,sysex,len,timestamp);
      if (bVar1) {
        return bVar1;
      }
      iVar2 = (*this->reportHandler->_vptr_ReportHandler[7])();
    } while ((char)iVar2 != '\0');
  }
  return bVar1;
}

Assistant:

bool Synth::playSysex(const Bit8u *sysex, Bit32u len, Bit32u timestamp) {
	if (midiQueue == NULL) return false;
	if (midiDelayMode == MIDIDelayMode_DELAY_ALL) {
		timestamp = addMIDIInterfaceDelay(len, timestamp);
	}
	if (!activated) activated = true;
	do {
		if (midiQueue->pushSysex(sysex, len, timestamp)) return true;
	} while (reportHandler->onMIDIQueueOverflow());
	return false;
}